

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eckey_impl.h
# Opt level: O0

int secp256k1_eckey_pubkey_tweak_add(secp256k1_ge *key,secp256k1_scalar *tweak)

{
  int iVar1;
  undefined1 local_c0 [8];
  secp256k1_scalar one;
  secp256k1_gej pt;
  secp256k1_scalar *tweak_local;
  secp256k1_ge *key_local;
  
  secp256k1_gej_set_ge((secp256k1_gej *)(one.d + 3),key);
  secp256k1_scalar_set_int((secp256k1_scalar *)local_c0,1);
  secp256k1_ecmult((secp256k1_gej *)(one.d + 3),(secp256k1_gej *)(one.d + 3),
                   (secp256k1_scalar *)local_c0,tweak);
  iVar1 = secp256k1_gej_is_infinity((secp256k1_gej *)(one.d + 3));
  if (iVar1 == 0) {
    secp256k1_ge_set_gej(key,(secp256k1_gej *)(one.d + 3));
  }
  key_local._4_4_ = (uint)(iVar1 == 0);
  return key_local._4_4_;
}

Assistant:

static int secp256k1_eckey_pubkey_tweak_add(secp256k1_ge *key, const secp256k1_scalar *tweak) {
    secp256k1_gej pt;
    secp256k1_scalar one;
    secp256k1_gej_set_ge(&pt, key);
    secp256k1_scalar_set_int(&one, 1);
    secp256k1_ecmult(&pt, &pt, &one, tweak);

    if (secp256k1_gej_is_infinity(&pt)) {
        return 0;
    }
    secp256k1_ge_set_gej(key, &pt);
    return 1;
}